

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseData<QList<QByteArray>>::
resolve<QtPromisePrivate::PromiseValue<QList<QByteArray>>const&>
          (PromiseData<QList<QByteArray>> *this,PromiseValue<QList<QByteArray>_> *value)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  QList<QByteArray> *__tmp;
  
  peVar1 = (value->m_data).super___shared_ptr<QList<QByteArray>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (value->m_data).super___shared_ptr<QList<QByteArray>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  *(element_type **)(this + 0x58) = peVar1;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60) = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::setSettled
            ((PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)> *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }